

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_video.c
# Opt level: O0

void video_display(ALLEGRO_VIDEO *video)

{
  ALLEGRO_FONT *pAVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long lVar9;
  char *pcVar10;
  undefined8 in_RDI;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined4 uVar21;
  undefined8 in_XMM7_Qa;
  undefined4 uVar22;
  double p;
  ALLEGRO_COLOR bc;
  ALLEGRO_COLOR tc;
  int y;
  int x;
  int h;
  int w;
  ALLEGRO_BITMAP *frame;
  float scaled_h;
  float scaled_w;
  int local_20;
  int local_1c;
  
  uVar22 = (undefined4)((ulong)in_XMM7_Qa >> 0x20);
  uVar21 = (undefined4)((ulong)in_XMM6_Qa >> 0x20);
  uVar8 = (undefined4)((ulong)in_XMM5_Qa >> 0x20);
  uVar7 = (undefined4)((ulong)in_XMM4_Qa >> 0x20);
  fVar11 = (float)al_get_video_scaled_width(in_RDI);
  fVar12 = (float)al_get_video_scaled_height(in_RDI);
  lVar9 = al_get_video_frame(in_RDI);
  uVar19 = 0;
  uVar13 = al_map_rgba_f(0);
  uVar18 = 0x3f000000;
  uVar14 = al_map_rgba_f(0x3f000000,0x3f000000,0x3f000000);
  if (lVar9 != 0) {
    if ((zoom != 0.0) || (NAN(zoom))) {
      local_1c = (int)fVar11;
      local_20 = (int)fVar12;
    }
    else {
      local_20 = al_get_display_height(screen);
      local_1c = (int)(((float)local_20 * fVar11) / fVar12);
      iVar3 = al_get_display_width(screen);
      if (iVar3 < local_1c) {
        local_1c = al_get_display_width(screen);
        local_20 = (int)(((float)local_1c * fVar12) / fVar11);
      }
    }
    iVar3 = al_get_display_width(screen);
    iVar4 = al_get_display_height(screen);
    iVar5 = al_get_bitmap_width();
    iVar6 = al_get_bitmap_height(lVar9);
    uVar20 = (ulong)(uint)(float)iVar5;
    al_draw_scaled_bitmap
              (0,0,uVar20,(float)iVar6,CONCAT44(uVar7,(float)((iVar3 - local_1c) / 2)),
               CONCAT44(uVar8,(float)((iVar4 - local_20) / 2)),CONCAT44(uVar21,(float)local_1c),
               CONCAT44(uVar22,(float)local_20),lVar9);
    uVar7 = (undefined4)(uVar20 >> 0x20);
    iVar3 = al_get_display_width(screen);
    al_draw_filled_rounded_rectangle
              (0x40800000,0x40800000,CONCAT44(uVar7,(float)(iVar3 + -4)),0x42700000,0x41000000,
               0x41000000,uVar14,uVar18);
    dVar15 = (double)al_get_video_position(in_RDI,0);
    al_draw_textf(uVar13,uVar19,0x41000000,font,0,"%s",filename);
    pAVar1 = font;
    dVar16 = (double)al_get_video_position(in_RDI,1);
    dVar17 = (double)al_get_video_position(in_RDI,2);
    al_draw_textf(uVar13,uVar19,0x41000000,0x41a80000,dVar16 - dVar15,dVar17 - dVar15,pAVar1,0,
                  "%3d:%02d (V: %+5.2f A: %+5.2f)",(int)(dVar15 / 60.0),(int)dVar15 % 0x3c);
    pAVar1 = font;
    uVar14 = al_get_video_fps(in_RDI);
    uVar7 = al_get_bitmap_width(lVar9);
    uVar8 = al_get_bitmap_height(lVar9);
    uVar18 = al_get_video_audio_rate(in_RDI);
    al_draw_textf(uVar13,uVar19,0x41000000,0x42080000,uVar14,(double)(fVar11 / fVar12),uVar18,pAVar1
                  ,0,"video rate %.02f (%dx%d, aspect %.1f) audio rate %.0f",uVar7,uVar8);
    pAVar1 = font;
    cVar2 = al_is_video_playing(in_RDI);
    pcVar10 = "false";
    if (cVar2 != '\0') {
      pcVar10 = "true";
    }
    al_draw_textf(uVar13,uVar19,0x41000000,0x423c0000,pAVar1,0,"playing: %s",pcVar10);
    al_flip_display();
    uVar13 = al_map_rgb(0,0);
    al_clear_to_color(uVar13,uVar19);
  }
  return;
}

Assistant:

static void video_display(ALLEGRO_VIDEO *video)
{
   /* Videos often do not use square pixels - these return the scaled dimensions
    * of the video frame.
    */
   float scaled_w = al_get_video_scaled_width(video);
   float scaled_h = al_get_video_scaled_height(video);
   /* Get the currently visible frame of the video, based on clock
    * time.
    */
   ALLEGRO_BITMAP *frame = al_get_video_frame(video);
   int w, h, x, y;
   ALLEGRO_COLOR tc = al_map_rgba_f(0, 0, 0, 0.5);
   ALLEGRO_COLOR bc = al_map_rgba_f(0.5, 0.5, 0.5, 0.5);
   double p;

   if (!frame)
      return;

   if (zoom == 0) {
      /* Always make the video fit into the window. */
      h = al_get_display_height(screen);
      w = (int)(h * scaled_w / scaled_h);
      if (w > al_get_display_width(screen)) {
         w = al_get_display_width(screen);
         h = (int)(w * scaled_h / scaled_w);
      }
   }
   else {
      w = (int)scaled_w;
      h = (int)scaled_h;
   }
   x = (al_get_display_width(screen) - w) / 2;
   y = (al_get_display_height(screen) - h) / 2;

   /* Display the frame. */
   al_draw_scaled_bitmap(frame, 0, 0,
                         al_get_bitmap_width(frame),
                         al_get_bitmap_height(frame), x, y, w, h, 0);

   /* Show some video information. */
   al_draw_filled_rounded_rectangle(4, 4,
      al_get_display_width(screen) - 4, 4 + 14 * 4, 8, 8, bc);
   p = al_get_video_position(video, ALLEGRO_VIDEO_POSITION_ACTUAL);
   al_draw_textf(font, tc, 8, 8 , 0, "%s", filename);
   al_draw_textf(font, tc, 8, 8 + 13, 0, "%3d:%02d (V: %+5.2f A: %+5.2f)",
      (int)(p / 60),
      ((int)p) % 60,
      al_get_video_position(video, ALLEGRO_VIDEO_POSITION_VIDEO_DECODE) - p,
      al_get_video_position(video, ALLEGRO_VIDEO_POSITION_AUDIO_DECODE) - p);
   al_draw_textf(font, tc, 8, 8 + 13 * 2, 0,
      "video rate %.02f (%dx%d, aspect %.1f) audio rate %.0f",
         al_get_video_fps(video),
         al_get_bitmap_width(frame),
         al_get_bitmap_height(frame),
         scaled_w / scaled_h,
         al_get_video_audio_rate(video));
   al_draw_textf(font, tc, 8, 8 + 13 * 3, 0,
      "playing: %s", al_is_video_playing(video) ? "true" : "false");
   al_flip_display();
   al_clear_to_color(al_map_rgb(0, 0, 0));
}